

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.h
# Opt level: O2

string * __thiscall
cmExtraCodeBlocksGenerator::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this)

{
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetName() const
                         { return cmExtraCodeBlocksGenerator::GetActualName();}